

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * useStyledStreamWriter_abi_cxx11_(Value *root)

{
  size_t in_RCX;
  void *in_RSI;
  StyledStreamWriter *in_RDI;
  ostringstream sout;
  StyledStreamWriter writer;
  ostringstream local_230 [24];
  string *in_stack_fffffffffffffde8;
  StyledStreamWriter *in_stack_fffffffffffffdf0;
  allocator local_a1;
  string local_a0 [32];
  StyledStreamWriter local_80;
  void *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"\t",&local_a1);
  Json::StyledStreamWriter::StyledStreamWriter(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::ostringstream::ostringstream(local_230);
  Json::StyledStreamWriter::write(&local_80,(int)local_230,local_10,in_RCX);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_230);
  Json::StyledStreamWriter::~StyledStreamWriter(in_RDI);
  return (string *)in_RDI;
}

Assistant:

static std::string useStyledStreamWriter(
    Json::Value const& root)
{
  Json::StyledStreamWriter writer;
  std::ostringstream sout;
  writer.write(sout, root);
  return sout.str();
}